

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool __thiscall TimesAll<0,_0,_0>::propagate(TimesAll<0,_0,_0> *this)

{
  bool bVar1;
  int64_t y_max_00;
  int64_t in_RDI;
  int64_t unaff_retaddr;
  TimesAll<0,_0,_0> *in_stack_00000008;
  int64_t z_max;
  int64_t z_min;
  int64_t y_max;
  int64_t y_min;
  int64_t x_max;
  int64_t x_min;
  int64_t in_stack_000000e0;
  TimesAll<0,_0,_0> *in_stack_000000e8;
  undefined1 in_stack_000000f0 [16];
  undefined1 in_stack_00000100 [16];
  int64_t in_stack_00000120;
  int64_t in_stack_00000128;
  int64_t in_stack_00000130;
  IntView<0> *in_stack_ffffffffffffff60;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  y_max_00 = IntView<0>::getMin(in_stack_ffffffffffffff60);
  IntView<0>::getMax(in_stack_ffffffffffffff60);
  IntView<0>::getMin(in_stack_ffffffffffffff60);
  IntView<0>::getMax(in_stack_ffffffffffffff60);
  bVar1 = propagate_z(in_stack_00000008,unaff_retaddr,
                      CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,y_max_00)
  ;
  if (bVar1) {
    IntView<0>::getMin(in_stack_ffffffffffffff60);
    IntView<0>::getMax(in_stack_ffffffffffffff60);
    bVar1 = TimesAll<0,0,0>::propagate_xy<0,0>
                      (in_stack_000000e8,(IntView<0>)in_stack_00000100,(IntView<0>)in_stack_000000f0
                       ,in_stack_000000e0,in_stack_00000120,in_stack_00000128,in_stack_00000130);
    if (bVar1) {
      bVar1 = TimesAll<0,0,0>::propagate_xy<0,0>
                        (in_stack_000000e8,(IntView<0>)in_stack_00000100,
                         (IntView<0>)in_stack_000000f0,in_stack_000000e0,in_stack_00000120,
                         in_stack_00000128,in_stack_00000130);
      if (bVar1) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();

		// Propagating the bounds on z
		if (!propagate_z(x_min, x_max, y_min, y_max)) {
			return false;
		}

		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// Propagating the bounds on x
		if (!propagate_xy(x, y, y_min, y_max, z_min, z_max)) {
			return false;
		}

		// Propagating the bounds on y
		if (!propagate_xy(y, x, x_min, x_max, z_min, z_max)) {
			return false;
		}

		return true;
	}